

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.c++
# Opt level: O1

VoidPromiseAndPipeline * __thiscall
capnp::LocalClient::call
          (VoidPromiseAndPipeline *__return_storage_ptr__,LocalClient *this,uint64_t interfaceId,
          uint16_t methodId,Own<capnp::CallContextHook> *context)

{
  uint *puVar1;
  undefined8 *puVar2;
  ClientHook *pCVar3;
  ClientHook *pCVar4;
  CallContextHook *pCVar5;
  undefined8 uVar6;
  LocalClient *pLVar7;
  PromiseNode *pPVar8;
  Disposer *pDVar9;
  ForkBranchBase *pFVar10;
  EventLoop *pEVar11;
  Refcounted *refcounted;
  QueuedPipeline *this_00;
  PromiseForResult<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_capability_c__:476:34),_void>
  PVar12;
  Promise<void> PVar13;
  Own<kj::_::TransformPromiseNode<kj::Own<capnp::PipelineHook>,_kj::_::Void,_kj::CaptureByMove<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_capability_c__:485:9),_kj::Own<capnp::CallContextHook>_>,_kj::_::PropagateException>_>
  OVar14;
  Own<kj::_::TransformPromiseNode<kj::Own<capnp::PipelineHook>,_capnp::AnyPointer::Pipeline,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_capability_c__:490:59),_kj::_::PropagateException>_>
  OVar15;
  Own<kj::_::ExclusiveJoinPromiseNode> OVar16;
  PromiseForResult<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_capability_c__:490:59),_capnp::AnyPointer::Pipeline>
  tailPipelinePromise;
  ForkedPromise<void> forked;
  PromiseForResult<kj::CaptureByMove<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_capability_c__:485:9),_kj::Own<capnp::CallContextHook>_>,_void>
  pipelinePromise;
  Promise<void> completionPromise;
  Promise<void> promise;
  undefined1 local_a8 [8];
  CallContextHook *local_a0;
  undefined1 local_98 [16];
  Own<capnp::LocalClient> local_88;
  Own<kj::_::PromiseNode> local_78;
  Own<kj::_::PromiseNode> local_68;
  ForkBranchBase *pFStack_58;
  CallContextHook *local_50;
  EventLoop *local_48;
  undefined1 auStack_40 [24];
  
  local_50 = context->ptr;
  pFStack_58 = (ForkBranchBase *)CONCAT62(pFStack_58._2_6_,methodId);
  local_68.disposer = (Disposer *)this;
  local_68.ptr = (PromiseNode *)interfaceId;
  kj::_::yield();
  PVar12 = kj::Promise<void>::
           then<capnp::LocalClient::call(unsigned_long,unsigned_short,kj::Own<capnp::CallContextHook>&&)::_lambda()_1_,kj::_::PropagateException>
                     ((Promise<void> *)&local_88,(anon_class_32_4_d5fa3d7c_for_func *)local_98,
                      (PropagateException *)&local_68);
  uVar6 = local_98._8_8_;
  if ((EventLoop *)local_98._8_8_ != (EventLoop *)0x0) {
    local_98._8_8_ = (EventLoop *)0x0;
    (**((ClientHook *)local_98._0_8_)->_vptr_ClientHook)
              (local_98._0_8_,
               (long)(EventPort **)uVar6 + (long)(*(EventPort **)uVar6)[-2]._vptr_EventPort,
               PVar12.super_PromiseBase.node.ptr);
  }
  puVar1 = &(this->super_Refcounted).refcount;
  *puVar1 = *puVar1 + 1;
  local_98._0_8_ = &this->super_Refcounted;
  local_98._8_8_ = this;
  PVar13 = kj::Promise<void>::attach<kj::Own<capnp::LocalClient>>
                     ((Promise<void> *)(auStack_40 + 8),&local_88);
  uVar6 = local_98._8_8_;
  if ((EventLoop *)local_98._8_8_ != (EventLoop *)0x0) {
    local_98._8_8_ = (EventLoop *)0x0;
    (**((ClientHook *)local_98._0_8_)->_vptr_ClientHook)
              (local_98._0_8_,
               ((ClientHook *)uVar6)->_vptr_ClientHook[-2] +
               (long)&((ClientHook *)uVar6)->_vptr_ClientHook,PVar13.super_PromiseBase.node.ptr);
  }
  pLVar7 = local_88.ptr;
  if (local_88.ptr != (LocalClient *)0x0) {
    local_88.ptr = (LocalClient *)0x0;
    (**(local_88.disposer)->_vptr_Disposer)
              (local_88.disposer,
               (pLVar7->super_ClientHook)._vptr_ClientHook[-2] + (long)&pLVar7->super_ClientHook);
  }
  kj::Promise<void>::fork((Promise<void> *)&local_88);
  PVar13 = kj::_::ForkHub<kj::_::Void>::addBranch((ForkHub<kj::_::Void> *)local_a8);
  (*context->ptr->_vptr_CallContextHook[7])
            (&local_48,context->ptr,PVar13.super_PromiseBase.node.ptr);
  local_68.ptr = (PromiseNode *)local_48;
  pFStack_58 = (ForkBranchBase *)auStack_40._0_8_;
  auStack_40._0_8_ = (long *)0x0;
  OVar14 = kj::
           heap<kj::_::TransformPromiseNode<kj::Own<capnp::PipelineHook>,kj::_::Void,kj::CaptureByMove<capnp::LocalClient::call(unsigned_long,unsigned_short,kj::Own<capnp::CallContextHook>&&)::_lambda(kj::Own<capnp::CallContextHook>&&)_1_,kj::Own<capnp::CallContextHook>>,kj::_::PropagateException>,kj::Own<kj::_::PromiseNode>,kj::CaptureByMove<capnp::LocalClient::call(unsigned_long,unsigned_short,kj::Own<capnp::CallContextHook>&&)::_lambda(kj::Own<capnp::CallContextHook>&&)_1_,kj::Own<capnp::CallContextHook>>,kj::_::PropagateException>
                     ((Own<kj::_::PromiseNode> *)local_98,
                      (CaptureByMove<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_capability_c__:485:9),_kj::Own<capnp::CallContextHook>_>
                       *)local_a8,(PropagateException *)&local_68);
  pFVar10 = pFStack_58;
  local_78.disposer._0_4_ = local_98._0_4_;
  local_78.disposer._4_4_ = local_98._4_4_;
  local_78.ptr = (PromiseNode *)local_98._8_8_;
  if (pFStack_58 != (ForkBranchBase *)0x0) {
    pFStack_58 = (ForkBranchBase *)0x0;
    (*(code *)((EventPort *)(local_68.ptr)->_vptr_PromiseNode)->_vptr_EventPort)
              (local_68.ptr,
               (pFVar10->super_PromiseNode)._vptr_PromiseNode[-2] +
               (long)&(pFVar10->super_PromiseNode)._vptr_PromiseNode,OVar14.ptr);
  }
  uVar6 = auStack_40._0_8_;
  if ((long *)auStack_40._0_8_ != (long *)0x0) {
    auStack_40._0_8_ = (long *)0x0;
    (*(code *)local_48->port->_vptr_EventPort)
              (local_48,(char *)(uVar6 + *(long *)(*(long *)uVar6 + -0x10)));
  }
  pCVar5 = local_a0;
  if (local_a0 != (CallContextHook *)0x0) {
    local_a0 = (CallContextHook *)0x0;
    (**(code **)*(_func_int **)local_a8)
              (local_a8,pCVar5->_vptr_CallContextHook[-2] + (long)&pCVar5->_vptr_CallContextHook);
  }
  (*context->ptr->_vptr_CallContextHook[5])(local_a8);
  OVar15 = kj::
           heap<kj::_::TransformPromiseNode<kj::Own<capnp::PipelineHook>,capnp::AnyPointer::Pipeline,capnp::LocalClient::call(unsigned_long,unsigned_short,kj::Own<capnp::CallContextHook>&&)::_lambda(capnp::AnyPointer::Pipeline&&)_1_,kj::_::PropagateException>,kj::Own<kj::_::PromiseNode>,capnp::LocalClient::call(unsigned_long,unsigned_short,kj::Own<capnp::CallContextHook>&&)::_lambda(capnp::AnyPointer::Pipeline&&)_1_,kj::_::PropagateException>
                     (&local_68,(anon_class_1_0_00000001_for_func *)local_a8,
                      (PropagateException *)&local_48);
  pCVar5 = local_a0;
  local_98._0_8_ = local_68.disposer;
  local_98._8_8_ = local_68.ptr;
  if (local_a0 != (CallContextHook *)0x0) {
    local_a0 = (CallContextHook *)0x0;
    (**(code **)*(_func_int **)local_a8)
              (local_a8,pCVar5->_vptr_CallContextHook[-2] + (long)&pCVar5->_vptr_CallContextHook,
               OVar15.ptr);
  }
  OVar16 = kj::
           heap<kj::_::ExclusiveJoinPromiseNode,kj::Own<kj::_::PromiseNode>,kj::Own<kj::_::PromiseNode>>
                     ((kj *)&local_68,&local_78,(Own<kj::_::PromiseNode> *)local_98);
  pDVar9 = local_68.disposer;
  puVar2 = (undefined8 *)CONCAT44(local_78.disposer._4_4_,local_78.disposer._0_4_);
  local_78.disposer._0_1_ = local_68.disposer._0_1_;
  local_78.disposer._1_3_ = local_68.disposer._1_3_;
  local_78.disposer._4_4_ = local_68.disposer._4_4_;
  pEVar11 = (EventLoop *)local_68.ptr;
  local_68.disposer = pDVar9;
  if ((EventLoop *)local_78.ptr != (EventLoop *)0x0) {
    pCVar3 = (ClientHook *)&(local_78.ptr)->_vptr_PromiseNode;
    pCVar4 = (ClientHook *)&(local_78.ptr)->_vptr_PromiseNode;
    local_78.ptr = (PromiseNode *)(EventLoop *)local_68.ptr;
    (**(code **)*puVar2)
              (puVar2,pCVar3->_vptr_ClientHook[-2] + (long)&pCVar4->_vptr_ClientHook,OVar16.ptr);
    pEVar11 = (EventLoop *)local_78.ptr;
  }
  local_78.ptr = (PromiseNode *)pEVar11;
  kj::_::ForkHub<kj::_::Void>::addBranch((ForkHub<kj::_::Void> *)local_a8);
  PVar13 = kj::Promise<void>::attach<kj::Own<capnp::CallContextHook>>
                     ((Promise<void> *)&local_68,(Own<capnp::CallContextHook> *)local_a8);
  pCVar5 = local_a0;
  if (local_a0 != (CallContextHook *)0x0) {
    local_a0 = (CallContextHook *)0x0;
    (**(code **)*(_func_int **)local_a8)
              (local_a8,pCVar5->_vptr_CallContextHook[-2] + (long)&pCVar5->_vptr_CallContextHook,
               PVar13.super_PromiseBase.node.ptr);
  }
  (__return_storage_ptr__->promise).super_PromiseBase.node.disposer = local_68.disposer;
  (__return_storage_ptr__->promise).super_PromiseBase.node.ptr = local_68.ptr;
  local_68.ptr = (PromiseNode *)0x0;
  this_00 = (QueuedPipeline *)operator_new(0x48);
  QueuedPipeline::QueuedPipeline(this_00,(Promise<kj::Own<capnp::PipelineHook>_> *)&local_78);
  pPVar8 = local_68.ptr;
  puVar1 = &(this_00->super_Refcounted).refcount;
  *puVar1 = *puVar1 + 1;
  (__return_storage_ptr__->pipeline).disposer = &(this_00->super_Refcounted).super_Disposer;
  (__return_storage_ptr__->pipeline).ptr = (PipelineHook *)this_00;
  if ((ExceptionOrValue *)local_68.ptr != (ExceptionOrValue *)0x0) {
    local_68.ptr = (PromiseNode *)0x0;
    (**((ClientHook *)&(local_68.disposer)->_vptr_Disposer)->_vptr_ClientHook)
              (local_68.disposer,
               (*(_func_int ***)&((Maybe<kj::Exception> *)&pPVar8->_vptr_PromiseNode)->ptr)[-2] +
               (long)&((Maybe<kj::Exception> *)&pPVar8->_vptr_PromiseNode)->ptr);
  }
  uVar6 = local_98._8_8_;
  if ((EventLoop *)local_98._8_8_ != (EventLoop *)0x0) {
    local_98._8_8_ = (EventLoop *)0x0;
    (**((ClientHook *)local_98._0_8_)->_vptr_ClientHook)
              (local_98._0_8_,
               (_func_int *)
               ((long)(*(EventPort **)uVar6)[-2]._vptr_EventPort + (long)(EventPort **)uVar6));
  }
  pPVar8 = local_78.ptr;
  if ((EventLoop *)local_78.ptr != (EventLoop *)0x0) {
    local_78.ptr = (PromiseNode *)0x0;
    (*(code *)**(undefined8 **)CONCAT44(local_78.disposer._4_4_,local_78.disposer._0_4_))
              ((undefined8 *)CONCAT44(local_78.disposer._4_4_,local_78.disposer._0_4_),
               (_func_int *)
               ((long)((EventPort *)pPVar8->_vptr_PromiseNode)[-2]._vptr_EventPort +
               (long)&pPVar8->_vptr_PromiseNode));
  }
  pLVar7 = local_88.ptr;
  if (local_88.ptr != (LocalClient *)0x0) {
    local_88.ptr = (LocalClient *)0x0;
    (**(local_88.disposer)->_vptr_Disposer)
              (local_88.disposer,
               (pLVar7->super_ClientHook)._vptr_ClientHook[-2] + (long)&pLVar7->super_ClientHook);
  }
  uVar6 = auStack_40._16_8_;
  if ((ArrayDisposer *)auStack_40._16_8_ != (ArrayDisposer *)0x0) {
    auStack_40._16_8_ = (ArrayDisposer *)0x0;
    (*(code *)**(undefined8 **)auStack_40._8_8_)
              (auStack_40._8_8_,(*(_func_int ***)uVar6)[-2] + (long)(_func_int ***)uVar6);
  }
  return __return_storage_ptr__;
}

Assistant:

VoidPromiseAndPipeline call(uint64_t interfaceId, uint16_t methodId,
                              kj::Own<CallContextHook>&& context) override {
    auto contextPtr = context.get();

    // We don't want to actually dispatch the call synchronously, because we don't want the callee
    // to have any side effects before the promise is returned to the caller.  This helps avoid
    // race conditions.
    //
    // So, we do an evalLater() here.
    //
    // Note also that QueuedClient depends on this evalLater() to ensure that pipelined calls don't
    // complete before 'whenMoreResolved()' promises resolve.
    auto promise = kj::evalLater([this,interfaceId,methodId,contextPtr]() {
      return server->dispatchCall(interfaceId, methodId,
                                  CallContext<AnyPointer, AnyPointer>(*contextPtr));
    }).attach(kj::addRef(*this));

    // We have to fork this promise for the pipeline to receive a copy of the answer.
    auto forked = promise.fork();

    auto pipelinePromise = forked.addBranch().then(kj::mvCapture(context->addRef(),
        [=](kj::Own<CallContextHook>&& context) -> kj::Own<PipelineHook> {
          context->releaseParams();
          return kj::refcounted<LocalPipeline>(kj::mv(context));
        }));

    auto tailPipelinePromise = context->onTailCall().then([](AnyPointer::Pipeline&& pipeline) {
      return kj::mv(pipeline.hook);
    });

    pipelinePromise = pipelinePromise.exclusiveJoin(kj::mv(tailPipelinePromise));

    auto completionPromise = forked.addBranch().attach(kj::mv(context));

    return VoidPromiseAndPipeline { kj::mv(completionPromise),
        kj::refcounted<QueuedPipeline>(kj::mv(pipelinePromise)) };
  }